

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RndFun.cpp
# Opt level: O0

void RPerm(Sarray *A,Sarray *B,vector<unsigned_long,_std::allocator<unsigned_long>_> *C,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *D)

{
  undefined4 local_2c;
  int RIndex;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *D_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *C_local;
  Sarray *B_local;
  Sarray *A_local;
  
  for (local_2c = 0; local_2c < 0x18; local_2c = local_2c + 1) {
    Theta(A,B,C,D);
    Rho(B,A);
    Pi(A,B);
    Chi(B,A);
    Iota(A,local_2c);
  }
  return;
}

Assistant:

void RPerm(Sarray &A, Sarray& B, vector<uint64_t> &C, vector<uint64_t> &D){
    for(int RIndex = 0; RIndex < 24; RIndex++){
        Theta(A, B, C, D);
        Rho(B, A);
        Pi(A, B);
        Chi(B, A);
        Iota(A, RIndex);
    }
}